

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O1

void __thiscall libtorrent::lsd_error_alert::~lsd_error_alert(lsd_error_alert *this)

{
  operator_delete(this,0x20);
  return;
}

Assistant:

struct TORRENT_EXPORT lsd_error_alert final : alert
	{
		// internal
		lsd_error_alert(aux::stack_allocator& alloc, error_code const& ec);

		TORRENT_DEFINE_ALERT(lsd_error_alert, 82)

		static constexpr alert_category_t static_category = alert_category::error;
		std::string message() const override;

		// The error code
		error_code error;
	}